

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O2

RelocList *
elf_newreloclist(size_t relasize,size_t writesize,
                _func_void_void_ptr_uint64_t_uint64_t_uint32_t_uint32_t_bool *initfunc)

{
  RelocList *l;
  
  l = (RelocList *)alloc(0x30);
  initlist((list *)l);
  l->relasize = relasize;
  l->writesize = writesize;
  l->initreloc = initfunc;
  return l;
}

Assistant:

struct RelocList *elf_newreloclist(size_t relasize,size_t writesize,
                                   void (*initfunc)(void *,uint64_t,uint64_t,
                                                    uint32_t,uint32_t,bool))
{
  struct RelocList *rl = alloc(sizeof(struct RelocList));

  initlist(&rl->l);
  rl->relasize = relasize;
  rl->writesize = writesize;
  rl->initreloc = initfunc;
  return rl;
}